

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O3

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,i64 *V)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar6;
  long lVar7;
  long lVar8;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  ulong uVar5;
  
  iVar3 = 2;
  if (2 < NArgs) {
    iVar3 = NArgs;
  }
  uVar5 = (ulong)(iVar3 - 1);
  lVar8 = 1 - uVar5;
  lVar1 = 2;
  do {
    lVar7 = lVar1;
    bVar2 = (byte)uVar5;
    if (lVar7 + lVar8 == 2) goto LAB_00103fab;
    uVar4 = strncmp(Args[lVar7 + -1],Opt,0x20);
    uVar5 = (ulong)uVar4;
    lVar1 = lVar7 + 1;
  } while (uVar4 != 0);
  local_40 = (anon_union_8_2_2df48d06_for_stref_0)
             ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar7))->Ptr;
  sVar6 = strlen(local_40.Ptr);
  local_38 = (undefined4)sVar6;
  bVar2 = ToInt64((stref *)&local_40,V);
LAB_00103fab:
  return (bool)(lVar7 < NArgs & bVar2);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, i64* V)
{
  for (int I = 1; I + 1 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      return ToInt64(Args[I + 1], V);
    }
  }

  return false;
}